

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::getChrmMatrixXYZ
               (float *m,float wX,float wY,float wZ,float rX,float rY,float rZ,float gX,float gY,
               float gZ,float bX,float bY,float bZ)

{
  uint uVar1;
  float *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  float bs;
  float gs;
  float rs;
  float t [9];
  float local_64;
  float local_60;
  float local_5c;
  float local_58 [10];
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float *local_10;
  uint local_4;
  
  local_30 = in_XMM7_Da;
  local_2c = in_XMM6_Da;
  local_28 = in_XMM5_Da;
  local_24 = in_XMM4_Da;
  local_20 = in_XMM3_Da;
  local_1c = in_XMM2_Da;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_10 = in_RDI;
  uVar1 = invMatrix(local_58);
  if (uVar1 == 0) {
    mulMatrix(&local_5c,&local_60,&local_64,local_58,(double)local_14,(double)local_18,
              (double)local_1c);
    *local_10 = local_5c * local_20;
    local_10[1] = local_60 * local_2c;
    local_10[2] = local_64 * t[0];
    local_10[3] = local_5c * local_24;
    local_10[4] = local_60 * local_30;
    local_10[5] = local_64 * t[2];
    local_10[6] = local_5c * local_28;
    local_10[7] = local_60 * gs;
    local_10[8] = local_64 * t[4];
  }
  local_4 = (uint)(uVar1 != 0);
  return local_4;
}

Assistant:

static unsigned getChrmMatrixXYZ(float* m,
                                 float wX, float wY, float wZ,
                                 float rX, float rY, float rZ,
                                 float gX, float gY, float gZ,
                                 float bX, float bY, float bZ) {
  float t[9];
  float rs, gs, bs;
  t[0] = rX; t[1] = gX; t[2] = bX;
  t[3] = rY; t[4] = gY; t[5] = bY;
  t[6] = rZ; t[7] = gZ; t[8] = bZ;
  if(invMatrix(t)) return 1; /* error, not invertible */
  mulMatrix(&rs, &gs, &bs, t, wX, wY, wZ);
  m[0] = rs * rX; m[1] = gs * gX; m[2] = bs * bX;
  m[3] = rs * rY; m[4] = gs * gY; m[5] = bs * bY;
  m[6] = rs * rZ; m[7] = gs * gZ; m[8] = bs * bZ;
  return 0;
}